

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

slot_type * __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
::start_slot(btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
             *this)

{
  byte bVar1;
  CopyConst<char,_ElementType<3UL>_> *pCVar2;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  bVar1 = start(this);
  local_38 = 1;
  uStack_30 = 0;
  uStack_28 = 4;
  uStack_20 = 0x1e;
  local_18 = 0x1f;
  pCVar2 = internal_layout::
           LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*,unsigned_int,unsigned_char,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
           ::Pointer<3ul,char>((LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*,unsigned_int,unsigned_char,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
                                *)&local_38,(char *)this);
  return pCVar2 + bVar1;
}

Assistant:

slot_type *start_slot() { return slot(start()); }